

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

void __thiscall CCollision::Init(CCollision *this,CLayers *pLayers)

{
  byte bVar1;
  int iVar2;
  CMapItemLayerTilemap *pCVar3;
  IMap *pIVar4;
  undefined4 extraout_var;
  long in_RSI;
  long *in_RDI;
  int Index;
  int i;
  int local_14;
  
  in_RDI[2] = in_RSI;
  pCVar3 = CLayers::GameLayer((CLayers *)in_RDI[2]);
  *(int *)(in_RDI + 1) = pCVar3->m_Width;
  pCVar3 = CLayers::GameLayer((CLayers *)in_RDI[2]);
  *(int *)((long)in_RDI + 0xc) = pCVar3->m_Height;
  pIVar4 = CLayers::Map((CLayers *)in_RDI[2]);
  pCVar3 = CLayers::GameLayer((CLayers *)in_RDI[2]);
  iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[2])(pIVar4,(ulong)(uint)pCVar3->m_Data);
  *in_RDI = CONCAT44(extraout_var,iVar2);
  for (local_14 = 0; local_14 < (int)in_RDI[1] * *(int *)((long)in_RDI + 0xc);
      local_14 = local_14 + 1) {
    bVar1 = *(byte *)(*in_RDI + (long)local_14 * 4);
    if (bVar1 < 0x81) {
      if (bVar1 == 1) {
        *(undefined1 *)(*in_RDI + (long)local_14 * 4) = 1;
      }
      else if (bVar1 == 2) {
        *(undefined1 *)(*in_RDI + (long)local_14 * 4) = 2;
      }
      else if (bVar1 == 3) {
        *(undefined1 *)(*in_RDI + (long)local_14 * 4) = 5;
      }
      else {
        *(undefined1 *)(*in_RDI + (long)local_14 * 4) = 0;
      }
    }
  }
  return;
}

Assistant:

void CCollision::Init(class CLayers *pLayers)
{
	m_pLayers = pLayers;
	m_Width = m_pLayers->GameLayer()->m_Width;
	m_Height = m_pLayers->GameLayer()->m_Height;
	m_pTiles = static_cast<CTile *>(m_pLayers->Map()->GetData(m_pLayers->GameLayer()->m_Data));

	for(int i = 0; i < m_Width*m_Height; i++)
	{
		int Index = m_pTiles[i].m_Index;

		if(Index > 128)
			continue;

		switch(Index)
		{
		case TILE_DEATH:
			m_pTiles[i].m_Index = COLFLAG_DEATH;
			break;
		case TILE_SOLID:
			m_pTiles[i].m_Index = COLFLAG_SOLID;
			break;
		case TILE_NOHOOK:
			m_pTiles[i].m_Index = COLFLAG_SOLID|COLFLAG_NOHOOK;
			break;
		default:
			m_pTiles[i].m_Index = 0;
		}
	}
}